

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O2

uint16_t __thiscall snmalloc::LocalEntropy::next_fresh_bits(LocalEntropy *this,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = this->count;
  if (n < uVar2) {
    uVar1 = this->fresh_bits;
  }
  else {
    uVar1 = get_next(this);
    uVar2 = 0x40;
  }
  this->fresh_bits = uVar1 >> ((byte)n & 0x3f);
  this->count = uVar2 - n;
  return ~(ushort)(-1L << ((byte)n & 0x3f)) & (ushort)uVar1;
}

Assistant:

uint16_t next_fresh_bits(size_t n)
    {
      if (count <= n)
      {
        fresh_bits = get_next();
        count = 64;
      }
      uint16_t result = static_cast<uint16_t>(fresh_bits & bits::mask_bits(n));
      fresh_bits >>= n;
      count -= n;
      return result;
    }